

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeNext(BtCursor *pCur,int *pRes)

{
  short sVar1;
  MemPage *pMVar2;
  byte bVar3;
  u32 newPgno;
  int iVar4;
  ulong uVar5;
  ushort uVar6;
  
  bVar3 = pCur->eState;
  if (bVar3 != 1) {
    if (2 < bVar3) {
      iVar4 = btreeRestoreCursorPosition(pCur);
      if (iVar4 != 0) {
        return iVar4;
      }
      bVar3 = pCur->eState;
    }
    if (bVar3 == 0) {
      *pRes = 1;
      return 0;
    }
    iVar4 = pCur->skipNext;
    if (iVar4 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (0 < iVar4) {
        return 0;
      }
    }
  }
  sVar1 = pCur->iPage;
  pMVar2 = pCur->apPage[sVar1];
  uVar6 = pCur->aiIdx[sVar1] + 1;
  pCur->aiIdx[sVar1] = uVar6;
  if (uVar6 < pMVar2->nCell) {
    if (pMVar2->leaf == '\0') {
LAB_001311f3:
      iVar4 = moveToLeftmost(pCur);
      return iVar4;
    }
  }
  else {
    if (pMVar2->leaf == '\0') {
      newPgno = sqlite3Get4byte(pMVar2->aData + (ulong)pMVar2->hdrOffset + 8);
      iVar4 = moveToChild(pCur,newPgno);
      if (iVar4 != 0) {
        return iVar4;
      }
      goto LAB_001311f3;
    }
    uVar5 = (ulong)(ushort)pCur->iPage;
    do {
      if ((short)uVar5 == 0) {
        *pRes = 1;
        pCur->eState = '\0';
        return 0;
      }
      moveToParent(pCur);
      uVar5 = (ulong)pCur->iPage;
    } while (pCur->apPage[uVar5]->nCell <= pCur->aiIdx[uVar5]);
    if (pCur->apPage[uVar5]->intKey != '\0') {
      iVar4 = sqlite3BtreeNext(pCur,pRes);
      return iVar4;
    }
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int btreeNext(BtCursor *pCur, int *pRes){
  int rc;
  int idx;
  MemPage *pPage;

  assert( cursorHoldsMutex(pCur) );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  assert( *pRes==0 );
  if( pCur->eState!=CURSOR_VALID ){
    assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      *pRes = 1;
      return SQLITE_OK;
    }
    if( pCur->skipNext ){
      assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_SKIPNEXT );
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext>0 ){
        pCur->skipNext = 0;
        return SQLITE_OK;
      }
      pCur->skipNext = 0;
    }
  }

  pPage = pCur->apPage[pCur->iPage];
  idx = ++pCur->aiIdx[pCur->iPage];
  assert( pPage->isInit );

  /* If the database file is corrupt, it is possible for the value of idx 
  ** to be invalid here. This can only occur if a second cursor modifies
  ** the page while cursor pCur is holding a reference to it. Which can
  ** only happen if the database is corrupt in such a way as to link the
  ** page into more than one b-tree structure. */
  testcase( idx>pPage->nCell );

  if( idx>=pPage->nCell ){
    if( !pPage->leaf ){
      rc = moveToChild(pCur, get4byte(&pPage->aData[pPage->hdrOffset+8]));
      if( rc ) return rc;
      return moveToLeftmost(pCur);
    }
    do{
      if( pCur->iPage==0 ){
        *pRes = 1;
        pCur->eState = CURSOR_INVALID;
        return SQLITE_OK;
      }
      moveToParent(pCur);
      pPage = pCur->apPage[pCur->iPage];
    }while( pCur->aiIdx[pCur->iPage]>=pPage->nCell );
    if( pPage->intKey ){
      return sqlite3BtreeNext(pCur, pRes);
    }else{
      return SQLITE_OK;
    }
  }
  if( pPage->leaf ){
    return SQLITE_OK;
  }else{
    return moveToLeftmost(pCur);
  }
}